

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O1

void Pdr_ManPrintCex(Aig_Man_t *pAig,Vec_Int_t *vCiObjs,Vec_Int_t *vCiVals,Vec_Int_t *vCi2Rem)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  void *__s;
  size_t __n;
  long lVar5;
  int level;
  size_t __size;
  void *pvVar6;
  int *piVar7;
  
  __n = (size_t)pAig->nObjs[2];
  __size = __n + 1;
  __s = malloc(__size);
  level = (int)__size;
  if ((long)__n < 1) {
    __n = 0;
  }
  else {
    pvVar6 = __s;
    memset(__s,0x2d,__n);
    level = (int)pvVar6;
  }
  *(undefined1 *)((long)__s + __n) = 0;
  iVar1 = vCiObjs->nSize;
  if (0 < (long)iVar1) {
    piVar3 = vCiObjs->pArray;
    pVVar4 = pAig->vObjs;
    lVar5 = 0;
    do {
      if (pVVar4 == (Vec_Ptr_t *)0x0) {
        piVar7 = (int *)0x0;
      }
      else {
        uVar2 = piVar3[lVar5];
        if (((int)uVar2 < 0) || (pVVar4->nSize <= (int)uVar2)) goto LAB_00571bec;
        piVar7 = (int *)pVVar4->pArray[uVar2];
      }
      if (vCiVals->nSize <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (0xfffffffd < (piVar7[6] & 7U) - 7) goto LAB_00571c0b;
      level = *piVar7;
      *(byte *)((long)__s + (long)level) = vCiVals->pArray[lVar5] == 0 ^ 0x31;
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  if ((vCi2Rem != (Vec_Int_t *)0x0) && (iVar1 = vCi2Rem->nSize, 0 < (long)iVar1)) {
    piVar3 = vCi2Rem->pArray;
    pVVar4 = pAig->vObjs;
    lVar5 = 0;
    do {
      if (pVVar4 == (Vec_Ptr_t *)0x0) {
        piVar7 = (int *)0x0;
      }
      else {
        uVar2 = piVar3[lVar5];
        if (((int)uVar2 < 0) || (pVVar4->nSize <= (int)uVar2)) {
LAB_00571bec:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        piVar7 = (int *)pVVar4->pArray[uVar2];
      }
      if (0xfffffffd < (piVar7[6] & 7U) - 7) {
LAB_00571c0b:
        __assert_fail("!Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
      }
      level = *piVar7;
      *(undefined1 *)((long)__s + (long)level) = 0x78;
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  Abc_Print(level,"%s\n",__s);
  if (__s != (void *)0x0) {
    free(__s);
    return;
  }
  return;
}

Assistant:

void Pdr_ManPrintCex( Aig_Man_t * pAig, Vec_Int_t * vCiObjs, Vec_Int_t * vCiVals, Vec_Int_t * vCi2Rem )
{
    Aig_Obj_t * pObj;
    int i;
    char * pBuff = ABC_ALLOC( char, Aig_ManCiNum(pAig)+1 );
    for ( i = 0; i < Aig_ManCiNum(pAig); i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    Aig_ManForEachObjVec( vCiObjs, pAig, pObj, i )
        pBuff[Aig_ObjCioId(pObj)] = (Vec_IntEntry(vCiVals, i)? '1':'0');
    if ( vCi2Rem )
    Aig_ManForEachObjVec( vCi2Rem, pAig, pObj, i )
        pBuff[Aig_ObjCioId(pObj)] = 'x';
    Abc_Print( 1, "%s\n", pBuff );
    ABC_FREE( pBuff );
}